

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

void __thiscall dg::pta::PointerAnalysis::queue_changed(PointerAnalysis *this)

{
  bool bVar1;
  long in_RDI;
  uint last_processed_num;
  uint in_stack_00000058;
  bool in_stack_0000005f;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_00000060;
  PointerGraph *in_stack_00000068;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffffd8;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_ffffffffffffffe0;
  
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::size
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)(in_RDI + 8));
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::clear
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x14cf3e);
  bVar1 = std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::empty
                    (in_stack_ffffffffffffffe0);
  if (!bVar1) {
    PointerGraph::getNodes<std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>
              (in_stack_00000068,in_stack_00000060,in_stack_0000005f,in_stack_00000058);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::operator=
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~vector
              (in_stack_ffffffffffffffe0);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::clear
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)0x14cf9c);
  }
  return;
}

Assistant:

void queue_changed() {
        unsigned last_processed_num = to_process.size();
        to_process.clear();

        if (!changed.empty()) {
            // DONT std::move - it prevents compiler from copy ellision
            to_process = PG->getNodes(changed /* starting set */,
                                      true /* interprocedural */,
                                      last_processed_num /* expected num */);

            // since changed was not empty,
            // the to_process must not be empty too
            assert(!to_process.empty());
            assert(to_process.size() >= changed.size());
            changed.clear();
        }
    }